

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void tooltip_cb(Fl_Input *i,void *v)

{
  char *n;
  int iVar1;
  bool bVar2;
  Fl_Type *pFVar3;
  
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar1 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Input_::static_value(&i->super_Fl_Input_,current_widget->tooltip_);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar2 = true;
    pFVar3 = Fl_Type::first;
    do {
      while ((pFVar3->selected != '\0' &&
             (iVar1 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3), iVar1 != 0))) {
        n = (i->super_Fl_Input_).value_;
        bVar2 = false;
        storestring(n,&pFVar3[1].user_data_type_,0);
        Fl_Widget::tooltip((Fl_Widget *)pFVar3[1].prev,n);
        pFVar3 = pFVar3->next;
        if (pFVar3 == (Fl_Type *)0x0) goto LAB_00183783;
      }
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    if (!bVar2) {
LAB_00183783:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void tooltip_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_widget()) {
      i->activate();
      i->static_value(((Fl_Widget_Type*)current_widget)->tooltip());
    } else i->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        ((Fl_Widget_Type*)o)->tooltip(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}